

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int orl_c_compl_bitaddr(em8051 *aCPU)

{
  byte bVar1;
  uint uVar2;
  int local_38;
  int local_34;
  int value_1;
  int bitmask_1;
  int bit_1;
  int value;
  int bitmask;
  int bit;
  int carry;
  int address;
  em8051 *aCPU_local;
  
  bVar1 = aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  uVar2 = (uint)bVar1;
  local_38 = (int)(aCPU->mSFR[0x50] & 0x80) >> 7;
  if (uVar2 < 0x80) {
    if (((uint)aCPU->mLowerData[((int)uVar2 >> 3) + 0x20] & 1 << (bVar1 & 7)) == 0) {
      local_38 = 1;
    }
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7f | (byte)(local_38 << 7);
  }
  else {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      bitmask_1 = (int)aCPU->mSFR[(int)((uVar2 & 0xf8) - 0x80)];
    }
    else {
      bitmask_1 = (*aCPU->sfrread)(aCPU,uVar2 & 0xf8);
    }
    local_34 = local_38;
    if ((bitmask_1 & 1 << (bVar1 & 7)) == 0) {
      local_34 = 1;
    }
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7f | (byte)(local_34 << 7);
  }
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int orl_c_compl_bitaddr(struct em8051 *aCPU)
{
    int address = OPERAND1;
    int carry = CARRY;
    if (address > 0x7f)
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address &= 0xf8;        
        if (aCPU->sfrread)
            value = aCPU->sfrread(aCPU, address);
        else
            value = aCPU->mSFR[address - 0x80];

        value = (value & bitmask) ? carry : 1;

        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }
    else
    {
        int bit = address & 7;
        int bitmask = (1 << bit);
        int value;
        address >>= 3;
        address += 0x20;
        value = (aCPU->mLowerData[address] & bitmask) ? carry : 1;
        PSW = (PSW & ~PSWMASK_C) | (PSWMASK_C * value);
    }
    PC += 2;
    return 0;
}